

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O3

bool __thiscall
uWS::WebSocketProtocol<true>::consumeContinuation
          (WebSocketProtocol<true> *this,char **src,uint *length,void *user)

{
  char cVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  byte *pbVar8;
  ulong uVar9;
  uint uVar10;
  byte *pbVar11;
  
  uVar6 = this->remainingBytes;
  uVar5 = *length;
  if (uVar5 < uVar6) {
    pbVar8 = (byte *)*src;
    uVar10 = (uVar5 & 0xfffffffc) + 4;
    if (uVar10 != 0) {
      pbVar11 = pbVar8 + uVar10;
      do {
        *pbVar8 = *pbVar8 ^ this->mask[0];
        pbVar8[1] = pbVar8[1] ^ this->mask[1];
        pbVar8[2] = pbVar8[2] ^ this->mask[2];
        pbVar8[3] = pbVar8[3] ^ this->mask[3];
        pbVar8 = pbVar8 + 4;
      } while (pbVar8 < pbVar11);
      uVar5 = *length;
      uVar6 = this->remainingBytes;
      pbVar8 = (byte *)*src;
    }
    this->remainingBytes = uVar6 - uVar5;
    bVar4 = handleFragment(this,(char *)pbVar8,(ulong)*length,uVar6 - uVar5,
                           (uint)this->opCode[(byte)this->opStack],this->lastFin != '\0',user);
    if (!bVar4) {
      uVar6 = *length;
      uVar5 = uVar6 & 3;
      if (uVar5 != 0) {
        cVar1 = this->mask[1];
        cVar2 = this->mask[2];
        cVar3 = this->mask[3];
        *(char *)((long)this + (0x1c - (ulong)uVar5)) = this->mask[0];
        this->mask[1 - uVar6 & 3] = cVar1;
        this->mask[4 - (ulong)uVar5 ^ 2] = cVar2;
        this->mask[(ulong)uVar5 ^ 3] = cVar3;
      }
    }
    bVar7 = false;
  }
  else {
    uVar5 = uVar6 & 0xfffffffc;
    if (uVar5 != 0) {
      pbVar11 = (byte *)*src;
      pbVar8 = pbVar11 + uVar5;
      do {
        *pbVar11 = *pbVar11 ^ this->mask[0];
        pbVar11[1] = pbVar11[1] ^ this->mask[1];
        pbVar11[2] = pbVar11[2] ^ this->mask[2];
        pbVar11[3] = pbVar11[3] ^ this->mask[3];
        pbVar11 = pbVar11 + 4;
      } while (pbVar11 < pbVar8);
      uVar6 = this->remainingBytes;
    }
    if ((uVar6 & 3) != 0) {
      uVar9 = 0;
      do {
        (*src)[uVar9 + (long)(int)uVar5] = (*src)[uVar9 + (long)(int)uVar5] ^ this->mask[uVar9];
        uVar9 = uVar9 + 1;
      } while ((uVar6 & 3) != uVar9);
      uVar6 = this->remainingBytes;
    }
    bVar7 = false;
    bVar4 = handleFragment(this,*src,(ulong)uVar6,0,(uint)this->opCode[(byte)this->opStack],
                           this->lastFin != '\0',user);
    if (!bVar4) {
      if (this->lastFin != '\0') {
        this->opStack = this->opStack + -1;
      }
      uVar6 = this->remainingBytes;
      *src = *src + uVar6;
      *length = *length - uVar6;
      this->state = '\0';
      bVar7 = true;
    }
  }
  return bVar7;
}

Assistant:

inline bool consumeContinuation(char *&src, unsigned int &length, void *user) {
        if (remainingBytes <= length) {
            if (isServer) {
                int n = remainingBytes >> 2;
                unmaskInplace(src, src + n * 4, mask);
                for (int i = 0, s = remainingBytes % 4; i < s; i++) {
                    src[n * 4 + i] ^= mask[i];
                }
            }

            if (handleFragment(src, remainingBytes, 0, opCode[(unsigned char) opStack], lastFin, user)) {
                return false;
            }

            if (lastFin) {
                opStack--;
            }

            src += remainingBytes;
            length -= remainingBytes;
            state = READ_HEAD;
            return true;
        } else {
            if (isServer) {
                unmaskInplace(src, src + ((length >> 2) + 1) * 4, mask);
            }

            remainingBytes -= length;
            if (handleFragment(src, length, remainingBytes, opCode[(unsigned char) opStack], lastFin, user)) {
                return false;
            }

            if (isServer && length % 4) {
                rotateMask(4 - (length % 4), mask);
            }
            return false;
        }
    }